

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall SQCompiler::LocalDeclStatement(SQCompiler *this)

{
  bool bVar1;
  SQObjectType SVar2;
  SQFuncState *this_00;
  SQObjectValue SVar3;
  long *in_RDI;
  SQObject SVar4;
  SQInteger in_stack_00000020;
  SQInteger dest;
  SQInteger src;
  SQCompiler *in_stack_00000040;
  bool in_stack_0000005f;
  SQInteger in_stack_00000060;
  SQInteger boundtarget;
  SQObject varname;
  SQCompiler *in_stack_ffffffffffffff80;
  SQFuncState *in_stack_ffffffffffffff88;
  SQFuncState *this_01;
  SQCompiler *in_stack_ffffffffffffff90;
  SQInteger in_stack_ffffffffffffffa0;
  SQInteger in_stack_ffffffffffffffa8;
  SQOpcode _op;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 uStack_2c;
  SQObject *pSVar5;
  
  Lex(in_stack_ffffffffffffff80);
  _op = (SQOpcode)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  if (*in_RDI == 0x11d) {
    Lex(in_stack_ffffffffffffff80);
    SVar4 = Expect((SQCompiler *)dest,in_stack_00000020);
    SVar3 = SVar4._unVal;
    pSVar5 = (SQObject *)CONCAT44(uStack_2c,SVar4._type);
    if (*in_RDI == 0x5b) {
      ParseBindEnv(in_stack_ffffffffffffff90);
    }
    Expect((SQCompiler *)dest,in_stack_00000020);
    CreateFunction((SQCompiler *)varname._0_8_,(SQObject *)boundtarget,in_stack_00000060,
                   in_stack_0000005f);
    this_01 = (SQFuncState *)in_RDI[1];
    this_00 = (SQFuncState *)SQFuncState::PushTarget(this_01,(SQInteger)in_stack_ffffffffffffff80);
    sqvector<SQObjectPtr>::size((sqvector<SQObjectPtr> *)(in_RDI[1] + 0x78));
    SQFuncState::AddInstruction
              ((SQFuncState *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),_op,
               in_stack_ffffffffffffffa0,(SQInteger)in_RDI,(SQInteger)this_00,(SQInteger)this_01);
    SQFuncState::PopTarget(this_00);
    SQFuncState::PushLocalVariable((SQFuncState *)SVar3.pTable,pSVar5);
  }
  else {
    while( true ) {
      SVar4 = Expect((SQCompiler *)dest,in_stack_00000020);
      SVar3 = SVar4._unVal;
      SVar2 = SVar4._type;
      pSVar5 = (SQObject *)CONCAT44(in_stack_ffffffffffffffb4,SVar2);
      if (*in_RDI == 0x3d) {
        Lex(in_stack_ffffffffffffff80);
        Expression(in_stack_00000040);
        in_stack_ffffffffffffffa8 = SQFuncState::PopTarget((SQFuncState *)in_stack_ffffffffffffff90)
        ;
        in_stack_ffffffffffffffa0 =
             SQFuncState::PushTarget(in_stack_ffffffffffffff88,(SQInteger)in_stack_ffffffffffffff80)
        ;
        if (in_stack_ffffffffffffffa0 != in_stack_ffffffffffffffa8) {
          bVar1 = SQFuncState::IsLocal
                            (in_stack_ffffffffffffff88,(SQUnsignedInteger)in_stack_ffffffffffffff80)
          ;
          if (bVar1) {
            SQFuncState::SnoozeOpt((SQFuncState *)in_RDI[1]);
          }
          SQFuncState::AddInstruction
                    ((SQFuncState *)CONCAT44(in_stack_ffffffffffffffb4,SVar2),
                     (SQOpcode)((ulong)in_stack_ffffffffffffffa8 >> 0x20),in_stack_ffffffffffffffa0,
                     (SQInteger)in_RDI,(SQInteger)in_stack_ffffffffffffff90,
                     (SQInteger)in_stack_ffffffffffffff88);
        }
      }
      else {
        in_stack_ffffffffffffff80 = (SQCompiler *)in_RDI[1];
        SQFuncState::PushTarget(in_stack_ffffffffffffff88,(SQInteger)in_stack_ffffffffffffff80);
        SQFuncState::AddInstruction
                  ((SQFuncState *)CONCAT44(in_stack_ffffffffffffffb4,SVar2),
                   (SQOpcode)((ulong)in_stack_ffffffffffffffa8 >> 0x20),in_stack_ffffffffffffffa0,
                   (SQInteger)in_RDI,(SQInteger)in_stack_ffffffffffffff90,
                   (SQInteger)in_stack_ffffffffffffff88);
      }
      SQFuncState::PopTarget((SQFuncState *)in_stack_ffffffffffffff90);
      SQFuncState::PushLocalVariable((SQFuncState *)SVar3.pTable,pSVar5);
      if (*in_RDI != 0x2c) break;
      Lex(in_stack_ffffffffffffff80);
    }
  }
  return;
}

Assistant:

void LocalDeclStatement()
    {
        SQObject varname;
        Lex();
        if( _token == TK_FUNCTION) {
			SQInteger boundtarget = 0xFF;
            Lex();
			varname = Expect(TK_IDENTIFIER);
			if (_token == _SC('[')) {
				boundtarget = ParseBindEnv();
			}
            Expect(_SC('('));
            CreateFunction(varname,0xFF,false);
            _fs->AddInstruction(_OP_CLOSURE, _fs->PushTarget(), _fs->_functions.size() - 1, boundtarget);
            _fs->PopTarget();
            _fs->PushLocalVariable(varname);
            return;
        }

        do {
            varname = Expect(TK_IDENTIFIER);
            if(_token == _SC('=')) {
                Lex(); Expression();
                SQInteger src = _fs->PopTarget();
                SQInteger dest = _fs->PushTarget();
                if (dest != src) {
                    if (_fs->IsLocal(src)) {
                        _fs->SnoozeOpt();
                    }
                    _fs->AddInstruction(_OP_MOVE, dest, src);
                }
            }
            else{
                _fs->AddInstruction(_OP_LOADNULLS, _fs->PushTarget(),1);
            }
            _fs->PopTarget();
            _fs->PushLocalVariable(varname);
            if(_token == _SC(',')) Lex(); else break;
        } while(1);
    }